

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalTree.h
# Opt level: O3

IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long> * __thiscall
IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>::operator=
          (IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long> *this,intervalTree *other)

{
  IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long> *pIVar1;
  _Head_base<0UL,_IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>_*,_false> _Var2;
  _Head_base<0UL,_IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>_*,_false> local_20;
  
  this->center = other->center;
  std::
  vector<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
  ::operator=(&this->intervals,&other->intervals);
  if ((other->left)._M_t.
      super___uniq_ptr_impl<IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::default_delete<IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>_*,_std::default_delete<IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
      .super__Head_base<0UL,_IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>_*,_false>.
      _M_head_impl == (IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long> *)0x0) {
    _Var2._M_head_impl = (IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long> *)0x0;
  }
  else {
    copyTree((IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long> *)&stack0xffffffffffffffe0,
             this);
    _Var2._M_head_impl = local_20._M_head_impl;
  }
  local_20._M_head_impl = (IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long> *)0x0;
  pIVar1 = (this->left)._M_t.
           super___uniq_ptr_impl<IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::default_delete<IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>_*,_std::default_delete<IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
           .
           super__Head_base<0UL,_IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>_*,_false>
           ._M_head_impl;
  (this->left)._M_t.
  super___uniq_ptr_impl<IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::default_delete<IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>_*,_std::default_delete<IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
  .super__Head_base<0UL,_IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>_*,_false>.
  _M_head_impl = _Var2._M_head_impl;
  if (pIVar1 != (IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long> *)0x0) {
    std::default_delete<IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>_>::operator()
              ((default_delete<IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>_> *)
               &this->left,pIVar1);
  }
  std::
  unique_ptr<IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::default_delete<IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
  ::~unique_ptr((unique_ptr<IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::default_delete<IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
                 *)&stack0xffffffffffffffe0);
  if ((other->right)._M_t.
      super___uniq_ptr_impl<IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::default_delete<IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>_*,_std::default_delete<IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
      .super__Head_base<0UL,_IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>_*,_false>.
      _M_head_impl == (IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long> *)0x0) {
    _Var2._M_head_impl = (IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long> *)0x0;
  }
  else {
    copyTree((IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long> *)&stack0xffffffffffffffe0,
             this);
    _Var2._M_head_impl = local_20._M_head_impl;
  }
  local_20._M_head_impl = (IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long> *)0x0;
  pIVar1 = (this->right)._M_t.
           super___uniq_ptr_impl<IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::default_delete<IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>_*,_std::default_delete<IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
           .
           super__Head_base<0UL,_IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>_*,_false>
           ._M_head_impl;
  (this->right)._M_t.
  super___uniq_ptr_impl<IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::default_delete<IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>_*,_std::default_delete<IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
  .super__Head_base<0UL,_IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>_*,_false>.
  _M_head_impl = _Var2._M_head_impl;
  if (pIVar1 != (IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long> *)0x0) {
    std::default_delete<IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>_>::operator()
              ((default_delete<IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>_> *)
               &this->right,pIVar1);
  }
  std::
  unique_ptr<IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::default_delete<IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
  ::~unique_ptr((unique_ptr<IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::default_delete<IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
                 *)&stack0xffffffffffffffe0);
  return this;
}

Assistant:

IntervalTree<T,K>& operator=(const intervalTree& other) {
        center = other.center;
        intervals = other.intervals;
        left = other.left ? copyTree(*other.left) : nullptr;
        right = other.right ? copyTree(*other.right) : nullptr;
        return *this;
    }